

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O0

int h261_block(bitstream *str,int32_t *block,int intra)

{
  int iVar1;
  uint uVar2;
  int in_EDX;
  uint *in_RSI;
  int *in_RDI;
  bool bVar3;
  int j;
  vs_vlc_val *tab;
  int32_t coeff;
  uint32_t sign;
  uint32_t eb;
  uint32_t run;
  uint32_t tmp;
  uint32_t val;
  int i;
  vs_vlc_val *in_stack_00000058;
  uint32_t *in_stack_00000060;
  bitstream *in_stack_00000068;
  int in_stack_ffffffffffffffbc;
  uint32_t *in_stack_ffffffffffffffc0;
  vs_vlc_val *val_00;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  int local_20;
  
  local_20 = 0;
  if (in_EDX != 0) {
    local_24 = *in_RSI;
    if (*in_RDI == 0) {
      if ((0xfe < local_24) || (local_24 == 0)) {
        fprintf(_stderr,"Invalid INTRA DC coeff\n");
        return 1;
      }
      if (local_24 == 0x80) {
        local_24 = 0xff;
      }
    }
    iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
    if (*in_RDI == 1) {
      if ((local_24 == 0) || (local_24 == 0x80)) {
        fprintf(_stderr,"Invalid INTRA DC coeff\n");
        return 1;
      }
      if (local_24 == 0xff) {
        local_24 = 0x80;
      }
      *in_RSI = local_24;
    }
    local_20 = 1;
  }
  while( true ) {
    if (local_20 == 0) {
      val_00 = block_0_vlc;
    }
    else {
      val_00 = block_vlc;
    }
    if (*in_RDI == 0) {
      local_2c = 0;
      while( true ) {
        bVar3 = false;
        if (local_20 < 0x40) {
          bVar3 = in_RSI[local_20] == 0;
        }
        if (!bVar3) break;
        local_20 = local_20 + 1;
        local_2c = local_2c + 1;
      }
      if (local_20 == 0x40) {
        local_28 = 0;
      }
      else {
        in_stack_ffffffffffffffc8 = in_RSI[local_20];
        uVar2 = in_stack_ffffffffffffffc8;
        if ((int)in_stack_ffffffffffffffc8 < 1) {
          uVar2 = -in_stack_ffffffffffffffc8;
        }
        if (0x7f < (int)uVar2) {
          fprintf(_stderr,"Coeff too large\n");
          return 1;
        }
        uVar2 = in_stack_ffffffffffffffc8;
        if ((int)in_stack_ffffffffffffffc8 < 1) {
          uVar2 = -in_stack_ffffffffffffffc8;
        }
        local_28 = uVar2 | local_2c << 0xc;
        in_stack_ffffffffffffffcc = (uint)((int)in_stack_ffffffffffffffc8 < 0);
        in_stack_ffffffffffffffbc = 0;
        while ((val_00[in_stack_ffffffffffffffbc].blen != 0 &&
               (val_00[in_stack_ffffffffffffffbc].val != local_28))) {
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1;
        }
        if (((val_00[in_stack_ffffffffffffffbc].val != 0 ^ 0xffU) & 1) != local_28) {
          local_28 = 0xfffff;
        }
        local_30 = in_stack_ffffffffffffffc8 & 0xff;
        local_20 = local_20 + 1;
      }
    }
    iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (iVar1 != 0) {
      return 1;
    }
    if (local_28 == 0) break;
    if (local_28 == 0xfffff) {
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   &val_00->val,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   &val_00->val,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      if ((local_30 == 0) || (local_30 == 0x80)) {
        fprintf(_stderr,"Invalid escape code\n");
        return 1;
      }
      in_stack_ffffffffffffffc8 = local_30;
      if (0x80 < (int)local_30) {
        in_stack_ffffffffffffffc8 = local_30 | 0xffffff00;
      }
    }
    else {
      iVar1 = vs_u((bitstream *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   &val_00->val,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      local_2c = local_28 >> 0xc;
      if (in_stack_ffffffffffffffcc == 0) {
        in_stack_ffffffffffffffc8 = local_28 & 0xfff;
      }
      else {
        in_stack_ffffffffffffffc8 = -(local_28 & 0xfff);
      }
    }
    if (*in_RDI == 1) {
      if (0x3f < local_20) {
        fprintf(_stderr,"block overflow\n");
        return 1;
      }
      while (local_2c != 0) {
        if (0x3f < local_20) {
          fprintf(_stderr,"block overflow\n");
          return 1;
        }
        in_RSI[local_20] = 0;
        local_2c = local_2c - 1;
        local_20 = local_20 + 1;
      }
      in_RSI[local_20] = in_stack_ffffffffffffffc8;
      local_2c = local_2c - 1;
      local_20 = local_20 + 1;
    }
  }
  if (*in_RDI == 1) {
    while (local_20 < 0x40) {
      in_RSI[local_20] = 0;
      local_20 = local_20 + 1;
    }
  }
  return 0;
}

Assistant:

int h261_block(struct bitstream *str, int32_t *block, int intra) {
	int i = 0;
	if (intra) {
		uint32_t val = block[0];
		if (str->dir == VS_ENCODE) {
			if (val >= 0xff || val == 0) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0x80)
				val = 0xff;
		}
		if (vs_u(str, &val, 8)) return 1;
		if (str->dir == VS_DECODE) {
			if (val == 0 || val == 0x80) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0xff)
				val = 0x80;
			block[0] = val;
		}
		i = 1;
	}
	while (1) {
		uint32_t tmp, run, eb, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (abs(coeff) > 127) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				eb = coeff & 0xff;
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			/* escape */
			if (vs_u(str, &run, 6)) return 1;
			if (vs_u(str, &eb, 8)) return 1;
			if (eb == 0 || eb == 0x80) {
				fprintf(stderr, "Invalid escape code\n");
				return 1;
			}
			coeff = eb;
			if (coeff > 0x80)
				coeff |= -0x100;
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}